

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddLinear.c
# Opt level: O0

Move * ddLinearAndSiftingDown(DdManager *table,int x,int xHigh,Move *prevMoves)

{
  int x_00;
  int iVar1;
  Move *pMVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  DdNode *pDVar6;
  int isolated;
  int yindex;
  int xindex;
  int limitSize;
  int R;
  int newsize;
  int size;
  int y;
  Move *move;
  Move *moves;
  Move *prevMoves_local;
  int xHigh_local;
  int x_local;
  DdManager *table_local;
  
  x_00 = table->invperm[x];
  yindex = table->keys - table->isolated;
  xindex = 0;
  for (newsize = xHigh; x < newsize; newsize = newsize + -1) {
    iVar1 = table->invperm[newsize];
    iVar3 = cuddTestInteract(table,x_00,iVar1);
    if (iVar3 != 0) {
      xindex = (table->subtables[newsize].keys - (uint)(table->vars[iVar1]->ref == 1)) + xindex;
    }
  }
  newsize = cuddNextHigh(table,x);
  R = yindex;
  move = prevMoves;
  prevMoves_local._4_4_ = x;
  while( true ) {
    if (xHigh < newsize || yindex <= R - xindex) {
      return move;
    }
    iVar1 = table->invperm[newsize];
    iVar3 = cuddTestInteract(table,x_00,iVar1);
    if (iVar3 != 0) {
      xindex = xindex - (table->subtables[newsize].keys - (uint)(table->vars[iVar1]->ref == 1));
    }
    R = cuddSwapInPlace(table,prevMoves_local._4_4_,newsize);
    if (((R == 0) || (iVar3 = cuddLinearInPlace(table,prevMoves_local._4_4_,newsize), iVar3 == 0))
       || (pDVar6 = cuddDynamicAllocNode(table), pDVar6 == (DdNode *)0x0)) break;
    pDVar6->index = prevMoves_local._4_4_;
    pDVar6->ref = newsize;
    (pDVar6->type).kids.T = (DdNode *)move;
    *(undefined4 *)&pDVar6->next = 0;
    move = (Move *)pDVar6;
    if (iVar3 < R) {
      iVar5 = cuddTestInteract(table,x_00,iVar1);
      if (iVar5 != 0) {
        *(undefined4 *)&pDVar6->next = 1;
        cuddUpdateInteractionMatrix(table,x_00,iVar1);
        R = iVar3;
      }
    }
    else {
      uVar4 = cuddLinearInPlace(table,prevMoves_local._4_4_,newsize);
      if (uVar4 == 0) break;
      if (uVar4 != R) {
        fprintf((FILE *)table->out,"Change in size after identity transformation! From %d to %d\n",
                (ulong)(uint)R,(ulong)uVar4);
      }
    }
    *(int *)((long)&pDVar6->next + 4) = R;
    if ((double)yindex * table->maxGrowth < (double)R) {
      return (Move *)pDVar6;
    }
    if (R < yindex) {
      yindex = R;
    }
    prevMoves_local._4_4_ = newsize;
    newsize = cuddNextHigh(table,newsize);
  }
  while (move != (Move *)0x0) {
    pMVar2 = move->next;
    move->y = 0;
    *(DdNode **)&move->flags = table->nextFree;
    table->nextFree = (DdNode *)move;
    move = pMVar2;
  }
  return (Move *)0xffffffffffffffff;
}

Assistant:

static Move *
ddLinearAndSiftingDown(
  DdManager * table,
  int  x,
  int  xHigh,
  Move * prevMoves)
{
    Move        *moves;
    Move        *move;
    int         y;
    int         size, newsize;
    int         R;      /* upper bound on node decrease */
    int         limitSize;
    int         xindex, yindex;
    int         isolated;
#ifdef DD_DEBUG
    int         checkR;
    int         z;
    int         zindex;
#endif

    moves = prevMoves;
    /* Initialize R */
    xindex = table->invperm[x];
    limitSize = size = table->keys - table->isolated;
    R = 0;
    for (y = xHigh; y > x; y--) {
        yindex = table->invperm[y];
        if (cuddTestInteract(table,xindex,yindex)) {
            isolated = table->vars[yindex]->ref == 1;
            R += table->subtables[y].keys - isolated;
        }
    }

    y = cuddNextHigh(table,x);
    while (y <= xHigh && size - R < limitSize) {
#ifdef DD_DEBUG
        checkR = 0;
        for (z = xHigh; z > x; z--) {
            zindex = table->invperm[z];
            if (cuddTestInteract(table,xindex,zindex)) {
                isolated = table->vars[zindex]->ref == 1;
                checkR += table->subtables[z].keys - isolated;
            }
        }
        if (R != checkR) {
            (void) fprintf(table->out, "checkR(%d) != R(%d)\n",checkR,R);
        }
#endif
        /* Update upper bound on node decrease. */
        yindex = table->invperm[y];
        if (cuddTestInteract(table,xindex,yindex)) {
            isolated = table->vars[yindex]->ref == 1;
            R -= table->subtables[y].keys - isolated;
        }
        size = cuddSwapInPlace(table,x,y);
        if (size == 0) goto ddLinearAndSiftingDownOutOfMem;
        newsize = cuddLinearInPlace(table,x,y);
        if (newsize == 0) goto ddLinearAndSiftingDownOutOfMem;
        move = (Move *) cuddDynamicAllocNode(table);
        if (move == NULL) goto ddLinearAndSiftingDownOutOfMem;
        move->x = x;
        move->y = y;
        move->next = moves;
        moves = move;
        move->flags = CUDD_SWAP_MOVE;
        if (newsize >= size) {
            /* Undo transformation. The transformation we apply is
            ** its own inverse. Hence, we just apply the transformation
            ** again.
            */
            newsize = cuddLinearInPlace(table,x,y);
            if (newsize == 0) goto ddLinearAndSiftingDownOutOfMem;
            if (newsize != size) {
                (void) fprintf(table->out,"Change in size after identity transformation! From %d to %d\n",size,newsize);
            }
        } else if (cuddTestInteract(table,xindex,yindex)) {
            size = newsize;
            move->flags = CUDD_LINEAR_TRANSFORM_MOVE;
            cuddUpdateInteractionMatrix(table,xindex,yindex);
        }
        move->size = size;
        if ((double) size > (double) limitSize * table->maxGrowth) break;
        if (size < limitSize) limitSize = size;
        x = y;
        y = cuddNextHigh(table,x);
    }
    return(moves);

ddLinearAndSiftingDownOutOfMem:
    while (moves != NULL) {
        move = moves->next;
        cuddDeallocMove(table, moves);
        moves = move;
    }
    return((Move *) CUDD_OUT_OF_MEM);

}